

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.hxx
# Opt level: O0

void __thiscall
nuraft::srv_config::srv_config
          (srv_config *this,int32 id,int32 dc_id,string *endpoint,string *aux,bool learner,
          int32 priority)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  string *in_R8;
  byte in_R9B;
  undefined4 in_stack_00000008;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 10),in_R8);
  *(byte *)(in_RDI + 0x12) = in_R9B & 1;
  in_RDI[0x13] = in_stack_00000008;
  return;
}

Assistant:

srv_config(int32 id,
               int32 dc_id,
               const std::string& endpoint,
               const std::string& aux,
               bool learner,
               int32 priority = INIT_PRIORITY)
        : id_(id)
        , dc_id_(dc_id)
        , endpoint_(endpoint)
        , aux_(aux)
        , learner_(learner)
        , priority_(priority)
        {}